

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void ndiLogState(ndicapi *pol,char *outInformation)

{
  char cVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  long *plVar5;
  ulong uVar6;
  char (*pacVar7) [32];
  char (*pacVar8) [20];
  char (*pacVar9) [2];
  char (*pacVar10) [52];
  char (*pacVar11) [8];
  char (*pacVar12) [12];
  char (*pacVar13) [24];
  char (*__s) [11];
  char (*__s_00) [3];
  int i;
  long lVar14;
  ulong uVar15;
  stringstream ss;
  uchar local_1f8;
  undefined7 uStack_1f7;
  ulong local_1f0;
  undefined1 local_1e8 [16];
  stringstream local_1d8 [16];
  long local_1c8 [14];
  ios_base local_158 [264];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  pacVar10 = pol->GxTransforms;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"GxTransforms[",0xd);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][52]: ",7);
    sVar4 = strlen(*pacVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar10,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar10 = pacVar10 + 1;
  } while (lVar14 != 3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"GxStatus[8]: ",0xd);
  sVar4 = strlen(pol->GxStatus);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->GxStatus,sVar4);
  pacVar12 = pol->GxInformation;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"GxInformation[",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][12]: ",7);
    sVar4 = strlen(*pacVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar12,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar12 = pacVar12 + 1;
  } while (lVar14 != 3);
  pacVar13 = pol->GxSingleStray;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"GxSingleStray[",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][24]: ",7);
    sVar4 = strlen(*pacVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar13,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar13 = pacVar13 + 1;
  } while (lVar14 != 3);
  pacVar11 = pol->GxFrame;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"GxFrame[",8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][8]: ",6);
    sVar4 = strlen(*pacVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar11,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar11 = pacVar11 + 1;
  } while (lVar14 != 3);
  pacVar10 = pol->GxPassiveTransforms;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"GxPassiveTransforms[",0x14);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][52]: ",7);
    sVar4 = strlen(*pacVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar10,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar10 = pacVar10 + 1;
  } while (lVar14 != 9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"GxPassiveStatus[24]: ",0x15);
  sVar4 = strlen(pol->GxPassiveStatus);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->GxPassiveStatus,sVar4);
  pacVar12 = pol->GxPassiveInformation;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"GxPassiveInformation[",0x15);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][12]: ",7);
    sVar4 = strlen(*pacVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar12,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar12 = pacVar12 + 1;
  } while (lVar14 != 9);
  pacVar11 = pol->GxPassiveFrame;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"GxPassiveFrame[",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][8]: ",6);
    sVar4 = strlen(*pacVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar11,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar11 = pacVar11 + 1;
  } while (lVar14 != 9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"GxPassiveStray[424]: ",0x15);
  sVar4 = strlen(pol->GxPassiveStray);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->GxPassiveStray,sVar4)
  ;
  pacVar7 = pol->PstatBasic;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PstatBasic[",0xb);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][32]: ",7);
    sVar4 = strlen(*pacVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar7,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar7 = pacVar7 + 1;
  } while (lVar14 != 3);
  pacVar11 = pol->PstatTesting;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PstatTesting[",0xd);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][8]: ",6);
    sVar4 = strlen(*pacVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar11,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar11 = pacVar11 + 1;
  } while (lVar14 != 3);
  pacVar8 = pol->PstatPartNumber;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PstatPartNumber[",0x10)
    ;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][20]: ",7);
    sVar4 = strlen(*pacVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar8,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar8 = pacVar8 + 1;
  } while (lVar14 != 3);
  pacVar9 = pol->PstatAccessories;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"PstatAccessories[",0x11);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][2]: ",6);
    sVar4 = strlen(*pacVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar9,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar9 = pacVar9 + 1;
  } while (lVar14 != 3);
  pacVar9 = pol->PstatMarkerType;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PstatMarkerType[",0x10)
    ;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][2]: ",6);
    sVar4 = strlen(*pacVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar9,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar9 = pacVar9 + 1;
  } while (lVar14 != 3);
  pacVar7 = pol->PstatPassiveBasic;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"PstatPassiveBasic[",0x12);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][32]: ",7);
    sVar4 = strlen(*pacVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar7,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar7 = pacVar7 + 1;
  } while (lVar14 != 9);
  pacVar11 = pol->PstatPassiveTesting;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"PstatPassiveTesting[",0x14);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][8]: ",6);
    sVar4 = strlen(*pacVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar11,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar11 = pacVar11 + 1;
  } while (lVar14 != 9);
  pacVar8 = pol->PstatPassivePartNumber;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"PstatPassivePartNumber[",0x17);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][20]: ",7);
    sVar4 = strlen(*pacVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar8,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar8 = pacVar8 + 1;
  } while (lVar14 != 9);
  pacVar9 = pol->PstatPassiveAccessories;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"PstatPassiveAccessories[",0x18);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][2]: ",6);
    sVar4 = strlen(*pacVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar9,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar9 = pacVar9 + 1;
  } while (lVar14 != 9);
  pacVar9 = pol->PstatPassiveMarkerType;
  lVar14 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"PstatPassiveMarkerType[",0x17);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][2]: ",6);
    sVar4 = strlen(*pacVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar9,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar14 = lVar14 + 1;
    pacVar9 = pacVar9 + 1;
  } while (lVar14 != 9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"SstatControl[2]: ",0x11);
  sVar4 = strlen(pol->SstatControl);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->SstatControl,sVar4);
  cVar1 = (char)(ostream *)local_1c8;
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"SstatSensor[2]: ",0x10);
  sVar4 = strlen(pol->SstatSensor);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->SstatSensor,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"SstatTiu[2]: ",0xd);
  sVar4 = strlen(pol->SstatTiu);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->SstatTiu,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"IrchkDetected: ",0xf);
  plVar5 = (long *)std::ostream::operator<<((ostream *)local_1c8,pol->IrchkDetected);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"IrchkSources[128]: ",0x13);
  sVar4 = strlen(pol->IrchkSources);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->IrchkSources,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PhrqReply[2]: ",0xe);
  sVar4 = strlen(pol->PhrqReply);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->PhrqReply,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PhsrReply[1284]: ",0x11);
  sVar4 = strlen(pol->PhsrReply);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->PhsrReply,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PhinfUnoccupied: ",0x11);
  plVar5 = (long *)std::ostream::operator<<((ostream *)local_1c8,pol->PhinfUnoccupied);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PhinfBasic[34]: ",0x10);
  sVar4 = strlen(pol->PhinfBasic);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->PhinfBasic,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"PhinfTesting[8]: ",0x11);
  sVar4 = strlen(pol->PhinfTesting);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->PhinfTesting,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"PhinfPartNumber[20]: ",0x15);
  sVar4 = strlen(pol->PhinfPartNumber);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->PhinfPartNumber,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"PhinfAccessories[2]: ",0x15);
  sVar4 = strlen(pol->PhinfAccessories);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->PhinfAccessories,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"PhinfMarkerType[2]: ",0x14);
  sVar4 = strlen(pol->PhinfMarkerType);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->PhinfMarkerType,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"PhinfPortLocation[14]: ",0x17);
  sVar4 = strlen(pol->PhinfPortLocation);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->PhinfPortLocation,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"PhinfGpioStatus[2]: ",0x14);
  sVar4 = strlen(pol->PhinfGpioStatus);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->PhinfGpioStatus,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"TxHandleCount: ",0xf);
  plVar5 = (long *)std::ostream::operator<<((ostream *)local_1c8,pol->TxHandleCount);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"TxHandles[NDI_MAX_HANDLES]: ",0x1c);
  sVar4 = strlen((char *)pol->TxHandles);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,(char *)pol->TxHandles,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (0 < pol->TxHandleCount) {
    pacVar10 = pol->TxTransforms;
    lVar14 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"TxTransforms[",0xd);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][52]: ",7);
      sVar4 = strlen(*pacVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar10,sVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar14 = lVar14 + 1;
      pacVar10 = pacVar10 + 1;
    } while (lVar14 < pol->TxHandleCount);
    if (0 < pol->TxHandleCount) {
      pacVar11 = pol->TxStatus;
      lVar14 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"TxStatus[",9);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][8]: ",6);
        sVar4 = strlen(*pacVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar11,sVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        lVar14 = lVar14 + 1;
        pacVar11 = pacVar11 + 1;
      } while (lVar14 < pol->TxHandleCount);
      if (0 < pol->TxHandleCount) {
        pacVar11 = pol->TxFrame;
        lVar14 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"TxFrame[",8);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][8]: ",6);
          sVar4 = strlen(*pacVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar11,sVar4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          lVar14 = lVar14 + 1;
          pacVar11 = pacVar11 + 1;
        } while (lVar14 < pol->TxHandleCount);
        if (0 < pol->TxHandleCount) {
          pacVar12 = pol->TxInformation;
          lVar14 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"TxInformation[",0xe);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][12]: ",7);
            sVar4 = strlen(*pacVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar12,sVar4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            lVar14 = lVar14 + 1;
            pacVar12 = pacVar12 + 1;
          } while (lVar14 < pol->TxHandleCount);
          if (0 < pol->TxHandleCount) {
            pacVar13 = pol->TxSingleStray;
            lVar14 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"TxSingleStray[",0xe);
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][24]: ",7);
              sVar4 = strlen(*pacVar13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,*pacVar13,sVar4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
              std::ostream::put((char)poVar3);
              std::ostream::flush();
              lVar14 = lVar14 + 1;
              pacVar13 = pacVar13 + 1;
            } while (lVar14 < pol->TxHandleCount);
          }
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"TxSystemStatus[4]: ",0x13);
  sVar4 = strlen(pol->TxSystemStatus);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->TxSystemStatus,sVar4)
  ;
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"TxPassiveStrayCount: ",0x15);
  plVar5 = (long *)std::ostream::operator<<((ostream *)local_1c8,pol->TxPassiveStrayCount);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"TxPassiveStrayOov[14]: ",0x17);
  sVar4 = strlen(pol->TxPassiveStrayOov);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->TxPassiveStrayOov,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"TxPassiveStray[1052]: ",0x16);
  sVar4 = strlen(pol->TxPassiveStray);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->TxPassiveStray,sVar4)
  ;
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"BxHandleCount: ",0xf);
  local_1f8 = pol->BxHandleCount;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,(char *)&local_1f8,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"BxHandles[NDI_MAX_HANDLES]: ",0x1c);
  sVar4 = strlen(pol->BxHandles);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pol->BxHandles,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"BxHandlesStatus[NDI_MAX_HANDLES]: ",0x22);
  sVar4 = strlen(pol->BxHandlesStatus);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->BxHandlesStatus,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"BxFrameNumber[NDI_MAX_HANDLES]: ",0x20);
  poVar3 = std::ostream::_M_insert<void_const*>((ostream *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (pol->BxHandleCount != '\0') {
    uVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"BxTransforms[",0xd);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][8]: ",6);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar15 = uVar15 + 1;
    } while (uVar15 < pol->BxHandleCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"BxPortStatus[NDI_MAX_HANDLES]: ",0x1f);
  poVar3 = std::ostream::_M_insert<void_const*>((ostream *)local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (pol->BxHandleCount != '\0') {
    __s = pol->BxToolMarkerInformation;
    uVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"BxToolMarkerInformation[",0x18);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][11]: ",7);
      sVar4 = strlen(*__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,*__s,sVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar15 = uVar15 + 1;
      __s = __s + 1;
    } while (uVar15 < pol->BxHandleCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"BxActiveSingleStrayMarkerStatus[NDI_MAX_HANDLES]: ",0x32);
  sVar4 = strlen(pol->BxActiveSingleStrayMarkerStatus);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->BxActiveSingleStrayMarkerStatus,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (pol->BxHandleCount != '\0') {
    uVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"BxActiveSingleStrayMarkerPosition[",0x22);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][3]: ",6);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar15 = uVar15 + 1;
    } while (uVar15 < pol->BxHandleCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"Bx3DMarkerCount[NDI_MAX_HANDLES]: ",0x22);
  pcVar2 = pol->Bx3DMarkerCount;
  sVar4 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar2,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (pol->BxHandleCount != '\0') {
    __s_00 = pol->Bx3DMarkerOutOfVolume;
    uVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Bx3DMarkerOutOfVolume[",0x16);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)uVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][3]: ",6);
      sVar4 = strlen(*__s_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,*__s_00,sVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar15 = uVar15 + 1;
      uVar6 = (ulong)pol->BxHandleCount;
      __s_00 = __s_00 + 1;
    } while (uVar15 < uVar6);
    if (pol->BxHandleCount != 0) {
      uVar15 = 0;
      do {
        if ('\0' < pcVar2[uVar15]) {
          lVar14 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"Bx3DMarkerPosition[",0x13);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)uVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][3]: ",6);
            poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            lVar14 = lVar14 + 1;
          } while (lVar14 < pcVar2[uVar15]);
          uVar6 = (ulong)pol->BxHandleCount;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar6);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"BxPassiveStrayCount: ",0x15);
  plVar5 = (long *)std::ostream::operator<<((ostream *)local_1c8,pol->BxPassiveStrayCount);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"BxPassiveStrayOutOfVolume[30]: ",0x1f);
  sVar4 = strlen(pol->BxPassiveStrayOutOfVolume);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,pol->BxPassiveStrayOutOfVolume,sVar4);
  std::ios::widen((char)*(undefined8 *)(local_1c8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (0 < pol->BxPassiveStrayCount) {
    lVar14 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"BxPassiveStrayPosition[",0x17);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1c8,(int)lVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][3]: ",6);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar14 = lVar14 + 1;
    } while (lVar14 < pol->BxPassiveStrayCount);
  }
  std::__cxx11::stringbuf::str();
  if (local_1f0 < 0xffff) {
    if ((undefined1 *)CONCAT71(uStack_1f7,local_1f8) != local_1e8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1f7,local_1f8));
    }
    std::__cxx11::stringbuf::str();
    pcVar2 = (char *)CONCAT71(uStack_1f7,local_1f8);
    std::__cxx11::stringbuf::str();
    strncpy(outInformation,pcVar2,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if ((undefined1 *)CONCAT71(uStack_1f7,local_1f8) != local_1e8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1f7,local_1f8));
    }
    std::__cxx11::stringstream::~stringstream(local_1d8);
    std::ios_base::~ios_base(local_158);
    return;
  }
  __assert_fail("ss.str().size() < USHRT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/qiaotian[P]ndicapi/ndicapi.cxx"
                ,0xef,"void ndiLogState(ndicapi *, char *)");
}

Assistant:

ndicapiExport void ndiLogState(ndicapi* pol, char outInformation[USHRT_MAX])
{
#ifdef __cplusplus
  std::stringstream ss;
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxTransforms[" << i << "][52]: " << pol->GxTransforms[i] << std::endl;
  }
  ss << "GxStatus[8]: " << pol->GxStatus;
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxInformation[" << i << "][12]: " << pol->GxInformation[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxSingleStray[" << i << "][24]: " << pol->GxSingleStray[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxFrame[" << i << "][8]: " << pol->GxFrame[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveTransforms[" << i << "][52]: " << pol->GxPassiveTransforms[i] << std::endl;
  }
  ss << "GxPassiveStatus[24]: " << pol->GxPassiveStatus;
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveInformation[" << i << "][12]: " << pol->GxPassiveInformation[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveFrame[" << i << "][8]: " << pol->GxPassiveFrame[i] << std::endl;
  }
  ss << "GxPassiveStray[424]: " << pol->GxPassiveStray;
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatBasic[" << i << "][32]: " << pol->PstatBasic[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatTesting[" << i << "][8]: " << pol->PstatTesting[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatPartNumber[" << i << "][20]: " << pol->PstatPartNumber[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatAccessories[" << i << "][2]: " << pol->PstatAccessories[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatMarkerType[" << i << "][2]: " << pol->PstatMarkerType[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveBasic[" << i << "][32]: " << pol->PstatPassiveBasic[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveTesting[" << i << "][8]: " << pol->PstatPassiveTesting[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassivePartNumber[" << i << "][20]: " << pol->PstatPassivePartNumber[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveAccessories[" << i << "][2]: " << pol->PstatPassiveAccessories[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveMarkerType[" << i << "][2]: " << pol->PstatPassiveMarkerType[i] << std::endl;
  }
  ss << "SstatControl[2]: " << pol->SstatControl << std::endl;
  ss << "SstatSensor[2]: " << pol->SstatSensor << std::endl;
  ss << "SstatTiu[2]: " << pol->SstatTiu << std::endl;
  ss << "IrchkDetected: " << pol->IrchkDetected << std::endl;
  ss << "IrchkSources[128]: " << pol->IrchkSources << std::endl;
  ss << "PhrqReply[2]: " << pol->PhrqReply << std::endl;
  ss << "PhsrReply[1284]: " << pol->PhsrReply << std::endl;
  ss << "PhinfUnoccupied: " << pol->PhinfUnoccupied << std::endl;
  ss << "PhinfBasic[34]: " << pol->PhinfBasic << std::endl;
  ss << "PhinfTesting[8]: " << pol->PhinfTesting << std::endl;
  ss << "PhinfPartNumber[20]: " << pol->PhinfPartNumber << std::endl;
  ss << "PhinfAccessories[2]: " << pol->PhinfAccessories << std::endl;
  ss << "PhinfMarkerType[2]: " << pol->PhinfMarkerType << std::endl;
  ss << "PhinfPortLocation[14]: " << pol->PhinfPortLocation << std::endl;
  ss << "PhinfGpioStatus[2]: " << pol->PhinfGpioStatus << std::endl;
  ss << "TxHandleCount: " << pol->TxHandleCount << std::endl;
  ss << "TxHandles[NDI_MAX_HANDLES]: " << pol->TxHandles << std::endl;
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxTransforms[" << i << "][52]: " << pol->TxTransforms[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxStatus[" << i << "][8]: " << pol->TxStatus[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxFrame[" << i << "][8]: " << pol->TxFrame[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxInformation[" << i << "][12]: " << pol->TxInformation[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxSingleStray[" << i << "][24]: " << pol->TxSingleStray[i] << std::endl;
  }
  ss << "TxSystemStatus[4]: " << pol->TxSystemStatus << std::endl;
  ss << "TxPassiveStrayCount: " << pol->TxPassiveStrayCount << std::endl;
  ss << "TxPassiveStrayOov[14]: " << pol->TxPassiveStrayOov << std::endl;
  ss << "TxPassiveStray[1052]: " << pol->TxPassiveStray << std::endl;
  ss << "BxHandleCount: " << pol->BxHandleCount << std::endl;
  ss << "BxHandles[NDI_MAX_HANDLES]: " << pol->BxHandles << std::endl;
  ss << "BxHandlesStatus[NDI_MAX_HANDLES]: " << pol->BxHandlesStatus << std::endl;
  ss << "BxFrameNumber[NDI_MAX_HANDLES]: " << pol->BxFrameNumber << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxTransforms[" << i << "][8]: " << pol->BxTransforms[i] << std::endl;
  }
  ss << "BxPortStatus[NDI_MAX_HANDLES]: " << pol->BxPortStatus << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxToolMarkerInformation[" << i << "][11]: " << pol->BxToolMarkerInformation[i] << std::endl;
  }
  ss << "BxActiveSingleStrayMarkerStatus[NDI_MAX_HANDLES]: " << pol->BxActiveSingleStrayMarkerStatus << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxActiveSingleStrayMarkerPosition[" << i << "][3]: " << pol->BxActiveSingleStrayMarkerPosition[i] << std::endl;
  }
  ss << "Bx3DMarkerCount[NDI_MAX_HANDLES]: " << pol->Bx3DMarkerCount << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "Bx3DMarkerOutOfVolume[" << i << "][3]: " << pol->Bx3DMarkerOutOfVolume[i] << std::endl;
  }
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    for (int j = 0; j < pol->Bx3DMarkerCount[i]; j++)
    {
      ss << "Bx3DMarkerPosition[" << i << "][" << j << "][3]: " << pol->Bx3DMarkerPosition[i][j] << std::endl;
    }
  }
  ss << "BxPassiveStrayCount: " << pol->BxPassiveStrayCount << std::endl;
  ss << "BxPassiveStrayOutOfVolume[30]: " << pol->BxPassiveStrayOutOfVolume << std::endl;
  for (int i = 0; i < pol->BxPassiveStrayCount; ++i)
  {
    ss << "BxPassiveStrayPosition[" << i << "][3]: " << pol->BxPassiveStrayPosition[i] << std::endl;
  }

  assert(ss.str().size() < USHRT_MAX);
  strncpy(&outInformation[0], ss.str().c_str(), ss.str().size());
#else
  // Someone else can implement c style string building
#endif
}